

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_logit_bias_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  bool bVar1;
  reference plVar2;
  long lVar3;
  long *in_RSI;
  long in_RDI;
  llama_logit_bias *lb_1;
  iterator __end2;
  iterator __begin2;
  vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *__range2;
  size_t i;
  llama_logit_bias *lb;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *__range1;
  llama_sampler_logit_bias *ctx;
  vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *in_stack_ffffffffffffff98;
  reference in_stack_ffffffffffffffa0;
  value_type *in_stack_ffffffffffffffa8;
  __normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
  in_stack_ffffffffffffffb0;
  ulong local_40;
  __normal_iterator<const_llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
  local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  local_18 = *(long *)(in_RDI + 8);
  local_10 = in_RSI;
  bVar1 = std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::empty
                    ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)
                     in_stack_ffffffffffffffb0._M_current);
  if (!bVar1) {
    std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::clear
              ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)0x521b53);
    local_20 = local_18 + 8;
    local_28._M_current =
         (llama_logit_bias *)
         std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::begin
                   (in_stack_ffffffffffffff98);
    std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::end(in_stack_ffffffffffffff98)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<const_llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      plVar2 = __gnu_cxx::
               __normal_iterator<const_llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
               ::operator*(&local_28);
      if (((plVar2->token < 0) || ((ulong)local_10[1] <= (ulong)(long)plVar2->token)) ||
         (*(int *)(*local_10 + (long)plVar2->token * 0xc) != plVar2->token)) {
        std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::push_back
                  ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)
                   in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8);
      }
      else {
        lVar3 = *local_10 + (long)plVar2->token * 0xc;
        *(float *)(lVar3 + 4) = plVar2->bias + *(float *)(lVar3 + 4);
      }
      __gnu_cxx::
      __normal_iterator<const_llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
      ::operator++(&local_28);
    }
    bVar1 = std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::empty
                      ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)
                       in_stack_ffffffffffffffb0._M_current);
    if (!bVar1) {
      for (local_40 = 0; local_40 < (ulong)local_10[1]; local_40 = local_40 + 1) {
        std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::begin
                  (in_stack_ffffffffffffff98);
        std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::end
                  (in_stack_ffffffffffffff98);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
                                   *)in_stack_ffffffffffffffa0,
                                  (__normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
                                   *)in_stack_ffffffffffffff98), bVar1) {
          in_stack_ffffffffffffffa0 =
               __gnu_cxx::
               __normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
               ::operator*((__normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
                            *)&stack0xffffffffffffffb0);
          if (*(int *)(*local_10 + local_40 * 0xc) == in_stack_ffffffffffffffa0->token) {
            lVar3 = *local_10 + local_40 * 0xc;
            *(float *)(lVar3 + 4) = in_stack_ffffffffffffffa0->bias + *(float *)(lVar3 + 4);
            break;
          }
          __gnu_cxx::
          __normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
          ::operator++((__normal_iterator<llama_logit_bias_*,_std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>_>
                        *)&stack0xffffffffffffffb0);
        }
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_logit_bias_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_logit_bias *) smpl->ctx;

    if (ctx->logit_bias.empty()) {
        return;
    }

    ctx->to_search.clear();

    // update the candidates that have not been shuffled in the vocabulary (i.e. idx == id)
    for (const auto & lb : ctx->logit_bias) {
        if (lb.token >= 0 && cur_p->size > (size_t) lb.token && cur_p->data[lb.token].id == lb.token) {
            cur_p->data[lb.token].logit += lb.bias;
        } else {
            ctx->to_search.push_back(lb);
        }
    }

    if (ctx->to_search.empty()) {
        return;
    }

    // search for the remaining candidates that were not found in the previous step
    for (size_t i = 0; i < cur_p->size; ++i) {
        for (const auto & lb : ctx->to_search) {
            if (cur_p->data[i].id == lb.token) {
                cur_p->data[i].logit += lb.bias;
                break;
            }
        }
    }
}